

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::CmdLine::initialize(void)

{
  CommandLineDesc *this;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [32];
  
  this = (CommandLineDesc *)operator_new(0x98);
  anon_unknown.dwarf_5292d::CommandLineDesc::CommandLineDesc(this);
  ::(anonymous_namespace)::desc_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"global",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"",&local_61);
  declare_arg_group((string *)local_28,(string *)local_60,ARG_FLAGS_DEFAULT);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return;
}

Assistant:

void initialize() {
            desc_ = new CommandLineDesc;
            declare_arg_group("global", "");
        }